

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall phyr::Film::addSplat(Film *this,Point2f *pt,Spectrum *spec)

{
  bool bVar1;
  Pixel *pPVar2;
  double xyz [3];
  Point2<int> local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_40.x = (int)pt->x;
  local_40.y = (int)pt->y;
  bVar1 = insideExclusive<int>(&local_40,&this->croppedImageBounds);
  if (bVar1) {
    SampledSpectrum::toXYZConstants(spec,&local_38);
    pPVar2 = getPixel(this,&local_40);
    AtomicReal::add((AtomicReal *)&pPVar2->field_0x20,local_38);
    AtomicReal::add((AtomicReal *)&pPVar2->field_0x28,local_30);
    AtomicReal::add((AtomicReal *)&pPVar2->field_0x30,local_28);
  }
  return;
}

Assistant:

void Film::addSplat(const Point2f& pt, const Spectrum& spec) {
#ifndef PHYRAY_OPTIMIZE
    // Ignore invalid spectrum data
    if (spec.hasNaNs()) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) due to NaN value", pt.x, pt.y);
        return;
    }

    if (spec.getYConstant() < 0) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) with negative luminance", pt.x, pt.y);
        return;
    }

    if (std::isinf(spec.getYConstant())) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) with infinite luminance", pt.x, pt.y);
        return;
    }
#endif

    Point2i p(pt);
    if (!insideExclusive(p, croppedImageBounds)) return;

    // Get xyz contributions
    Real xyz[3];
    spec.toXYZConstants(xyz);
    // Add as splat to pixel
    Pixel& pixel = getPixel(p);
    pixel.splatXYZ[0].add(xyz[0]); pixel.splatXYZ[1].add(xyz[1]);
    pixel.splatXYZ[2].add(xyz[2]);
}